

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
Wrapper<ChronoFormatter<unsigned_int,true>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>
::Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
          (Wrapper<ChronoFormatter<unsigned_int,_true>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
           *this,ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s)

{
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *in_RSI;
  ChronoFormatter<unsigned_int,_true> *in_RDI;
  long in_FS_OFFSET;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  
  tp.__d.__r = (duration)((duration *)(in_FS_OFFSET + 0x28))->__r;
  ChronoFormatter<unsigned_int,true>::
  Ser<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
            (in_RDI,in_RSI,tp);
  if ((duration)*(long *)(in_FS_OFFSET + 0x28) == tp.__d.__r) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const { Formatter().Ser(s, m_object); }